

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintTwoBodies.cpp
# Opt level: O2

void __thiscall
chrono::ChConstraintTwoBodies::SetVariables
          (ChConstraintTwoBodies *this,ChVariables *mvariables_a,ChVariables *mvariables_b)

{
  uint __line;
  long lVar1;
  char *__assertion;
  
  if (mvariables_a != (ChVariables *)0x0) {
    lVar1 = __dynamic_cast(mvariables_a,&ChVariables::typeinfo,&ChVariablesBody::typeinfo,0);
    if (lVar1 != 0) {
      if (mvariables_b != (ChVariables *)0x0) {
        lVar1 = __dynamic_cast(mvariables_b,&ChVariables::typeinfo,&ChVariablesBody::typeinfo,0);
        if (lVar1 != 0) {
          (this->super_ChConstraintTwo).super_ChConstraint.valid = true;
          ChConstraint::UpdateActiveFlag((ChConstraint *)this);
          (this->super_ChConstraintTwo).variables_a = mvariables_a;
          (this->super_ChConstraintTwo).variables_b = mvariables_b;
          return;
        }
      }
      __assertion = "dynamic_cast<ChVariablesBody*>(mvariables_b)";
      __line = 0x40;
      goto LAB_00d2da2f;
    }
  }
  __assertion = "dynamic_cast<ChVariablesBody*>(mvariables_a)";
  __line = 0x3f;
LAB_00d2da2f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChConstraintTwoBodies.cpp"
                ,__line,
                "virtual void chrono::ChConstraintTwoBodies::SetVariables(ChVariables *, ChVariables *)"
               );
}

Assistant:

void ChConstraintTwoBodies::SetVariables(ChVariables* mvariables_a, ChVariables* mvariables_b) {
    assert(dynamic_cast<ChVariablesBody*>(mvariables_a));
    assert(dynamic_cast<ChVariablesBody*>(mvariables_b));

    if (!mvariables_a || !mvariables_b) {
        SetValid(false);
        return;
    }

    SetValid(true);
    variables_a = mvariables_a;
    variables_b = mvariables_b;
}